

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O1

Abc_Cex_t *
Gia_ManGenerateCounter(Gia_Man_t *pAig,int iFrame,int iOut,int nWords,int iPat,Vec_Int_t *vCis2Ids)

{
  int iVar1;
  uint uVar2;
  Abc_Cex_t *pAVar3;
  void *__ptr;
  long lVar4;
  long lVar5;
  int iVar6;
  bool bVar7;
  int local_64;
  
  pAVar3 = Abc_CexAlloc(pAig->nRegs,pAig->vCis->nSize - pAig->nRegs,iFrame + 1);
  pAVar3->iFrame = iFrame;
  pAVar3->iPo = iOut;
  local_64 = pAVar3->nRegs;
  __ptr = malloc((long)nWords << 2);
  if (-1 < iFrame) {
    iVar1 = 0;
    do {
      if (pAig->nRegs < pAig->vCis->nSize) {
        lVar4 = 0;
        do {
          if (vCis2Ids->nSize <= lVar4) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar6 = vCis2Ids->pArray[lVar4];
          if (iVar6 < pAVar3->nPis) {
            lVar5 = (ulong)(uint)nWords + 1;
            if (0 < nWords) {
              do {
                uVar2 = Gia_ManRandom(0);
                *(uint *)((long)__ptr + lVar5 * 4 + -8) = uVar2;
                lVar5 = lVar5 + -1;
              } while (1 < lVar5);
            }
            if ((*(uint *)((long)__ptr + (long)(iPat >> 5) * 4) & 1 << ((byte)iPat & 0x1f)) != 0) {
              iVar6 = iVar6 + local_64;
              (&pAVar3[1].iPo)[iVar6 >> 5] =
                   (&pAVar3[1].iPo)[iVar6 >> 5] | 1 << ((byte)iVar6 & 0x1f);
            }
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < (long)pAig->vCis->nSize - (long)pAig->nRegs);
      }
      local_64 = local_64 + pAVar3->nPis;
      bVar7 = iVar1 != iFrame;
      iVar1 = iVar1 + 1;
    } while (bVar7);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return pAVar3;
}

Assistant:

Abc_Cex_t * Gia_ManGenerateCounter( Gia_Man_t * pAig, int iFrame, int iOut, int nWords, int iPat, Vec_Int_t * vCis2Ids )
{
    Abc_Cex_t * p;
    unsigned * pData;
    int f, i, w, iPioId, Counter;
    p = Abc_CexAlloc( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), iFrame+1 );
    p->iFrame = iFrame;
    p->iPo    = iOut;
    // fill in the binary data
    Counter = p->nRegs;
    pData = ABC_ALLOC( unsigned, nWords );
    for ( f = 0; f <= iFrame; f++, Counter += p->nPis )
    for ( i = 0; i < Gia_ManPiNum(pAig); i++ )
    {
        iPioId = Vec_IntEntry( vCis2Ids, i );
        if ( iPioId >= p->nPis )
            continue;
        for ( w = nWords-1; w >= 0; w-- )
            pData[w] = Gia_ManRandom( 0 );
        if ( Abc_InfoHasBit( pData, iPat ) )
            Abc_InfoSetBit( p->pData, Counter + iPioId );
    }
    ABC_FREE( pData );
    return p;
}